

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s2shape_index.cc
# Opt level: O3

bool __thiscall S2ShapeIndexCell::Decode(S2ShapeIndexCell *this,int num_shape_ids,Decoder *decoder)

{
  byte *pbVar1;
  bool bVar2;
  uint uVar3;
  reference pvVar4;
  uchar *puVar5;
  int32 *piVar6;
  byte *pbVar7;
  byte *pbVar8;
  long lVar9;
  ulong uVar10;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar11;
  anon_union_8_2_2d159a09_for_S2ClippedShape_3 *paVar12;
  uint uVar13;
  int iVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  int num_edges;
  uint64 header;
  S2LogMessage local_40;
  
  if (num_shape_ids == 1) {
    uVar15 = *(uint *)&(this->shapes_).
                       super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> &
             0xffffff;
    gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::resize
              ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)this,
               uVar15 + 1);
    pvVar4 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                       ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)this,
                        uVar15);
    puVar5 = (uchar *)Varint::Parse64WithLimit
                                ((char *)decoder->buf_,(char *)decoder->limit_,(uint64 *)&local_40);
    if (puVar5 == (uchar *)0x0) {
      return false;
    }
    decoder->buf_ = puVar5;
    if ((local_40._0_8_ & 1) == 0) {
      pvVar4->shape_id_ = 0;
      uVar16 = (uint)((ulong)local_40._0_8_ >> 2) & 0xf;
      uVar15 = uVar16 * 2 + 4;
      *(uint *)&pvVar4->field_0x4 = uVar15;
      if (((ulong)local_40._0_8_ >> 2 & 0xf) != 0) {
        piVar6 = (int32 *)operator_new__((ulong)((uVar16 + 2) * 4));
        (pvVar4->field_3).edges_ = piVar6;
      }
      *(uint *)&pvVar4->field_0x4 = uVar15 | (uint)((ulong)local_40._0_8_ >> 1) & 1;
      uVar10 = (ulong)local_40._0_8_ >> 6;
      lVar9 = 0;
      do {
        paVar11 = &pvVar4->field_3;
        if (5 < *(uint *)&pvVar4->field_0x4) {
          paVar11 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar4->field_3).edges_;
        }
        *(int *)((long)paVar11 + lVar9) = (int)uVar10;
        uVar10 = (ulong)((int)uVar10 + 1);
        lVar9 = lVar9 + 4;
      } while ((ulong)uVar16 * 4 + 8 != lVar9);
    }
    else {
      if ((local_40._0_8_ & 2) != 0) {
        pvVar4->shape_id_ = 0;
        iVar14 = (int)((ulong)local_40._0_8_ >> 3);
        uVar15 = iVar14 * 2;
        *(uint *)&pvVar4->field_0x4 = uVar15;
        if (5 < uVar15) {
          uVar10 = 0xffffffffffffffff;
          if (-1 < iVar14) {
            uVar10 = ((ulong)local_40._0_8_ >> 3 & 0xffffffff) << 2;
          }
          piVar6 = (int32 *)operator_new__(uVar10);
          (pvVar4->field_3).edges_ = piVar6;
        }
        *(uint *)&pvVar4->field_0x4 = uVar15 | local_40.severity_ >> 2 & 1;
        bVar2 = DecodeEdges(iVar14,pvVar4,decoder);
        return bVar2;
      }
      pvVar4->shape_id_ = 0;
      *(uint *)&pvVar4->field_0x4 = (uint)((ulong)local_40._0_8_ >> 2) & 1 | 2;
      (pvVar4->field_3).inline_edges_._M_elems[0] = (int)((ulong)local_40._0_8_ >> 3);
    }
  }
  else {
    pbVar8 = decoder->buf_;
    pbVar1 = decoder->limit_;
    if (pbVar1 <= pbVar8) {
      return false;
    }
    pbVar7 = pbVar8 + 1;
    uVar15 = *pbVar8 & 0x7f;
    if ((char)*pbVar8 < '\0') {
      if (pbVar1 <= pbVar7) {
        return false;
      }
      pbVar7 = pbVar8 + 2;
      uVar15 = uVar15 | (pbVar8[1] & 0x7f) << 7;
      if ((char)pbVar8[1] < '\0') {
        if (pbVar1 <= pbVar7) {
          return false;
        }
        pbVar7 = pbVar8 + 3;
        uVar15 = uVar15 | (pbVar8[2] & 0x7f) << 0xe;
        if ((char)pbVar8[2] < '\0') {
          if (pbVar1 <= pbVar7) {
            return false;
          }
          pbVar7 = pbVar8 + 4;
          uVar15 = uVar15 | (pbVar8[3] & 0x7f) << 0x15;
          if ((char)pbVar8[3] < '\0') {
            if (pbVar1 <= pbVar7) {
              return false;
            }
            if (0xf < pbVar8[4]) {
              return false;
            }
            pbVar7 = pbVar8 + 5;
            uVar15 = uVar15 | (uint)pbVar8[4] << 0x1c;
          }
        }
      }
    }
    decoder->buf_ = pbVar7;
    uVar13 = 1;
    uVar16 = uVar15;
    if ((uVar15 & 7) == 3) {
      if (pbVar1 <= pbVar7) {
        return false;
      }
      pbVar8 = pbVar7 + 1;
      uVar16 = *pbVar7 & 0x7f;
      if ((char)*pbVar7 < '\0') {
        if (pbVar1 <= pbVar8) {
          return false;
        }
        pbVar8 = pbVar7 + 2;
        uVar16 = uVar16 | (pbVar7[1] & 0x7f) << 7;
        if ((char)pbVar7[1] < '\0') {
          if (pbVar1 <= pbVar8) {
            return false;
          }
          pbVar8 = pbVar7 + 3;
          uVar16 = uVar16 | (pbVar7[2] & 0x7f) << 0xe;
          if ((char)pbVar7[2] < '\0') {
            if (pbVar1 <= pbVar8) {
              return false;
            }
            pbVar8 = pbVar7 + 4;
            uVar16 = uVar16 | (pbVar7[3] & 0x7f) << 0x15;
            if ((char)pbVar7[3] < '\0') {
              if (pbVar1 <= pbVar8) {
                return false;
              }
              if (0xf < pbVar7[4]) {
                return false;
              }
              pbVar8 = pbVar7 + 5;
              uVar16 = uVar16 | (uint)pbVar7[4] << 0x1c;
            }
          }
        }
      }
      uVar13 = uVar15 >> 3;
      decoder->buf_ = pbVar8;
    }
    uVar15 = *(uint *)&(this->shapes_).
                       super_compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> &
             0xffffff;
    gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::resize
              ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)this,
               uVar15 + uVar13);
    pvVar4 = gtl::compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_>::operator[]
                       ((compact_array_base<S2ClippedShape,_std::allocator<S2ClippedShape>_> *)this,
                        uVar15);
    if (uVar13 == 0) {
      return true;
    }
    paVar11 = &pvVar4->field_3;
    iVar14 = 0;
    uVar15 = 0;
    do {
      if (uVar15 != 0) {
        pbVar8 = decoder->buf_;
        pbVar1 = decoder->limit_;
        if (pbVar1 <= pbVar8) {
          return false;
        }
        pbVar7 = pbVar8 + 1;
        uVar16 = *pbVar8 & 0x7f;
        if ((char)*pbVar8 < '\0') {
          if (pbVar1 <= pbVar7) {
            return false;
          }
          pbVar7 = pbVar8 + 2;
          uVar16 = uVar16 | (pbVar8[1] & 0x7f) << 7;
          if ((char)pbVar8[1] < '\0') {
            if (pbVar1 <= pbVar7) {
              return false;
            }
            pbVar7 = pbVar8 + 3;
            uVar16 = uVar16 | (pbVar8[2] & 0x7f) << 0xe;
            if ((char)pbVar8[2] < '\0') {
              if (pbVar1 <= pbVar7) {
                return false;
              }
              pbVar7 = pbVar8 + 4;
              uVar16 = uVar16 | (pbVar8[3] & 0x7f) << 0x15;
              if ((char)pbVar8[3] < '\0') {
                if (pbVar1 <= pbVar7) {
                  return false;
                }
                if (0xf < pbVar8[4]) {
                  return false;
                }
                pbVar7 = pbVar8 + 5;
                uVar16 = uVar16 | (uint)pbVar8[4] << 0x1c;
              }
            }
          }
        }
        decoder->buf_ = pbVar7;
      }
      if ((uVar16 & 1) == 0) {
        pbVar8 = decoder->buf_;
        pbVar1 = decoder->limit_;
        if (pbVar1 <= pbVar8) {
          return false;
        }
        pbVar7 = pbVar8 + 1;
        uVar17 = *pbVar8 & 0x7f;
        if ((char)*pbVar8 < '\0') {
          if (pbVar1 <= pbVar7) {
            return false;
          }
          pbVar7 = pbVar8 + 2;
          uVar17 = uVar17 | (pbVar8[1] & 0x7f) << 7;
          if ((char)pbVar8[1] < '\0') {
            if (pbVar1 <= pbVar7) {
              return false;
            }
            pbVar7 = pbVar8 + 3;
            uVar17 = uVar17 | (pbVar8[2] & 0x7f) << 0xe;
            if ((char)pbVar8[2] < '\0') {
              if (pbVar1 <= pbVar7) {
                return false;
              }
              pbVar7 = pbVar8 + 4;
              uVar17 = uVar17 | (pbVar8[3] & 0x7f) << 0x15;
              if ((char)pbVar8[3] < '\0') {
                if (pbVar1 <= pbVar7) {
                  return false;
                }
                if (0xf < pbVar8[4]) {
                  return false;
                }
                pbVar7 = pbVar8 + 5;
                uVar17 = (uint)pbVar8[4] << 0x1c | uVar17;
              }
            }
          }
        }
        decoder->buf_ = pbVar7;
        iVar14 = (uVar17 >> 4) + iVar14;
        uVar17 = uVar17 & 0xf;
        pvVar4->shape_id_ = iVar14;
        uVar3 = uVar17 * 2 + 2;
        *(uint *)&pvVar4->field_0x4 = uVar3;
        if (1 < uVar17) {
          piVar6 = (int32 *)operator_new__((ulong)((uVar17 + 1) * 4));
          (pvVar4->field_3).edges_ = piVar6;
          uVar3 = *(uint *)&pvVar4->field_0x4 & 0xfffffffe;
        }
        *(uint *)&pvVar4->field_0x4 = uVar16 >> 1 & 1 | uVar3;
        uVar3 = uVar16 >> 2;
        lVar9 = 0;
        do {
          paVar12 = paVar11;
          if (5 < *(uint *)&pvVar4->field_0x4) {
            paVar12 = (anon_union_8_2_2d159a09_for_S2ClippedShape_3 *)(pvVar4->field_3).edges_;
          }
          *(uint *)((long)paVar12 + lVar9) = uVar3;
          uVar3 = uVar3 + 1;
          lVar9 = lVar9 + 4;
        } while ((ulong)uVar17 * 4 + 4 != lVar9);
      }
      else if ((~uVar16 & 7) == 0) {
        iVar14 = (uVar16 >> 4) + iVar14;
        pvVar4->shape_id_ = iVar14;
        *(uint *)&pvVar4->field_0x4 = uVar16 >> 3 & 1;
      }
      else {
        if ((uVar16 & 3) != 1) {
          S2LogMessage::S2LogMessage
                    (&local_40,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/s2shape_index.cc"
                     ,0xf1,kFatal,(ostream *)&std::cerr);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_40.stream_,"Check failed: (header & 3) == (1) ",0x22);
          abort();
        }
        pbVar8 = decoder->buf_;
        pbVar1 = decoder->limit_;
        if (pbVar1 <= pbVar8) {
          return false;
        }
        pbVar7 = pbVar8 + 1;
        uVar17 = *pbVar8 & 0x7f;
        if ((char)*pbVar8 < '\0') {
          if (pbVar1 <= pbVar7) {
            return false;
          }
          pbVar7 = pbVar8 + 2;
          uVar17 = uVar17 | (pbVar8[1] & 0x7f) << 7;
          if ((char)pbVar8[1] < '\0') {
            if (pbVar1 <= pbVar7) {
              return false;
            }
            pbVar7 = pbVar8 + 3;
            uVar17 = uVar17 | (pbVar8[2] & 0x7f) << 0xe;
            if ((char)pbVar8[2] < '\0') {
              if (pbVar1 <= pbVar7) {
                return false;
              }
              pbVar7 = pbVar8 + 4;
              uVar17 = uVar17 | (pbVar8[3] & 0x7f) << 0x15;
              if ((char)pbVar8[3] < '\0') {
                if (pbVar1 <= pbVar7) {
                  return false;
                }
                if (0xf < pbVar8[4]) {
                  return false;
                }
                pbVar7 = pbVar8 + 5;
                uVar17 = uVar17 | (uint)pbVar8[4] << 0x1c;
              }
            }
          }
        }
        decoder->buf_ = pbVar7;
        iVar14 = uVar17 + iVar14;
        pvVar4->shape_id_ = iVar14;
        uVar17 = (uVar16 >> 3) * 2 + 2;
        num_edges = (uVar16 >> 3) + 1;
        *(uint *)&pvVar4->field_0x4 = uVar17;
        if (0xf < uVar16) {
          piVar6 = (int32 *)operator_new__((ulong)(uint)(num_edges * 4));
          (pvVar4->field_3).edges_ = piVar6;
          uVar17 = *(uint *)&pvVar4->field_0x4 & 0xfffffffe;
        }
        *(uint *)&pvVar4->field_0x4 = uVar16 >> 2 & 1 | uVar17;
        bVar2 = DecodeEdges(num_edges,pvVar4,decoder);
        if (!bVar2) {
          return false;
        }
      }
      uVar15 = uVar15 + 1;
      pvVar4 = pvVar4 + 1;
      iVar14 = iVar14 + 1;
      paVar11 = paVar11 + 2;
    } while (uVar15 != uVar13);
  }
  return true;
}

Assistant:

bool S2ShapeIndexCell::Decode(int num_shape_ids, Decoder* decoder) {
  // This function inverts the encodings documented above.
  if (num_shape_ids == 1) {
    // Entire S2ShapeIndex contains only one shape.
    S2ClippedShape* clipped = add_shapes(1);
    uint64 header;
    if (!decoder->get_varint64(&header)) return false;
    if ((header & 1) == 0) {
      // The cell contains a contiguous range of edges.
      int num_edges = ((header >> 2) & 15) + 2;
      clipped->Init(0 /*shape_id*/, num_edges);
      clipped->set_contains_center((header & 2) != 0);
      for (int i = 0, edge_id = header >> 6; i < num_edges; ++i) {
        clipped->set_edge(i, edge_id + i);
      }
      return true;
    }
    if ((header & 2) == 0) {
      // The cell contains a single edge.
      clipped->Init(0 /*shape_id*/, 1 /*num_edges*/);
      clipped->set_contains_center((header & 4) != 0);
      clipped->set_edge(0, header >> 3);
      return true;
    }
    // The cell contains some other combination of edges.
    int num_edges = header >> 3;
    clipped->Init(0 /*shape_id*/, num_edges);
    clipped->set_contains_center((header & 4) != 0);
    return DecodeEdges(num_edges, clipped, decoder);
  }
  // S2ShapeIndex contains more than one shape.
  uint32 header;
  if (!decoder->get_varint32(&header)) return false;
  int num_clipped = 1;
  if ((header & 7) == 3) {
    // This cell contains more than one shape.
    num_clipped = header >> 3;
    if (!decoder->get_varint32(&header)) return false;
  }
  int shape_id = 0;
  S2ClippedShape* clipped = add_shapes(num_clipped);
  for (int j = 0; j < num_clipped; ++j, ++clipped, ++shape_id) {
    if (j > 0 && !decoder->get_varint32(&header)) return false;
    if ((header & 1) == 0) {
      // The clipped shape contains a contiguous range of edges.
      uint32 shape_id_count = 0;
      if (!decoder->get_varint32(&shape_id_count)) return false;
      shape_id += shape_id_count >> 4;
      int num_edges = (shape_id_count & 15) + 1;
      clipped->Init(shape_id, num_edges);
      clipped->set_contains_center((header & 2) != 0);
      for (int i = 0, edge_id = header >> 2; i < num_edges; ++i) {
        clipped->set_edge(i, edge_id + i);
      }
    } else if ((header & 7) == 7) {
      // The clipped shape has no edges.
      shape_id += header >> 4;
      clipped->Init(shape_id, 0);
      clipped->set_contains_center((header & 8) != 0);
    } else {
      // The clipped shape contains some other combination of edges.
      S2_DCHECK_EQ(header & 3, 1);
      uint32 shape_delta;
      if (!decoder->get_varint32(&shape_delta)) return false;
      shape_id += shape_delta;
      int num_edges = (header >> 3) + 1;
      clipped->Init(shape_id, num_edges);
      clipped->set_contains_center((header & 4) != 0);
      if (!DecodeEdges(num_edges, clipped, decoder)) return false;
    }
  }
  return true;
}